

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall CaDiCaL::Proof::delete_unit_clause(Proof *this,uint64_t id,int lit)

{
  int iVar1;
  iterator __position;
  int iVar2;
  ulong uVar3;
  int external_lit;
  int local_14;
  
  uVar3 = (ulong)(uint)-lit;
  if (0 < lit) {
    uVar3 = (ulong)(uint)lit;
  }
  iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  iVar2 = -iVar1;
  if (-1 < lit) {
    iVar2 = iVar1;
  }
  __position._M_current =
       (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->clause,__position,&local_14);
  }
  else {
    *__position._M_current = iVar2;
    (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this->clause_id = id;
  this->redundant = false;
  delete_clause(this);
  return;
}

Assistant:

void Proof::delete_unit_clause (uint64_t id, const int lit) {
  LOG ("PROOF deleting unit from proof %d", lit);
  assert (clause.empty ());
  add_literal (lit);
  clause_id = id;
  redundant = false;
  delete_clause ();
}